

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  uint *puVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  stringstream ss;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar6 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar6 != pcVar3) {
    do {
      cVar2 = *pcVar6;
      if ((uint)(int)cVar2 < 0x20) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<U+",3);
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        lVar4 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar4 + 1] == '\0') {
          std::ios::widen((char)(ostream *)local_1a8 + (char)lVar4);
          acStack_c8[lVar4 + 1] = '\x01';
        }
        acStack_c8[lVar4] = '0';
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)cVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d8);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if ('\x00' <= c and c <= '\x1F')
            {
                // escape control characters
                std::stringstream ss;
                ss << "<U+" << std::setw(4) << std::uppercase << std::setfill('0')
                   << std::hex << static_cast<int>(c) << ">";
                result += ss.str();
            }
            else
            {
                // add character as is
                result.push_back(c);
            }
        }

        return result;
    }